

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerRegeneration::DoEffect(APowerRegeneration *this)

{
  TObjPtr<AActor> *obj;
  bool bVar1;
  AActor *pAVar2;
  FSoundID local_14;
  
  APowerup::DoEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
  if (pAVar2 != (AActor *)0x0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((0 < pAVar2->health) && (((byte)level.time & 0x1f) == 0)) {
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar1 = P_GiveBody(pAVar2,(int)(this->super_APowerup).Strength,0);
      if (bVar1) {
        pAVar2 = GC::ReadBarrier<AActor>((AActor **)obj);
        S_FindSound("*regenerate");
        S_Sound(pAVar2,3,&local_14,1.0,1.0);
      }
    }
  }
  return;
}

Assistant:

void APowerRegeneration::DoEffect()
{
	Super::DoEffect();
	if (Owner != NULL && Owner->health > 0 && (level.time & 31) == 0)
	{
		if (P_GiveBody(Owner, int(Strength)))
		{
			S_Sound(Owner, CHAN_ITEM, "*regenerate", 1, ATTN_NORM );
		}
	}
}